

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O0

void make_version(void)

{
  int iVar1;
  uint uVar2;
  uint local_c;
  int i;
  
  version.incarnation = 0x100;
  version.feature_set = 0;
  for (local_c = 1; artifact_names[(int)local_c] != (char *)0x0; local_c = local_c + 1) {
  }
  iVar1 = local_c + -1;
  local_c = 1;
  while (objects[(int)local_c].oc_class != '\x01') {
    local_c = local_c + 1;
  }
  uVar2 = iVar1 * 0x1000 | local_c;
  local_c = 0;
  while (mons[(int)local_c].mlet != '\0') {
    local_c = local_c + 1;
  }
  version.entity_count = uVar2 << 0xc | local_c;
  return;
}

Assistant:

static void make_version(void)
{
	int i;

	/*
	 * integer version number
	 */
	version.incarnation = ((unsigned long)VERSION_MAJOR << 24) |
				((unsigned long)VERSION_MINOR << 16) |
				((unsigned long)PATCHLEVEL << 8) |
				((unsigned long)EDITLEVEL);
	/*
	 * encoded feature list
	 * Note:  if any of these magic numbers are changed or reassigned,
	 * EDITLEVEL in patchlevel.h should be incremented at the same time.
	 * The actual values have no special meaning, and the category
	 * groupings are just for convenience.
	 */
	version.feature_set = (unsigned long)(0L
		/* levels and/or topology (0..4) */
		/* monsters (5..9) */
#ifdef KOPS
			| (1L <<  6)
#endif
		/* objects (10..14) */
		/* flag bits and/or other global variables (15..26) */
			);
	/*
	 * Value used for object & monster sanity check.
	 *    (NROFARTIFACTS<<24) | (NUM_OBJECTS<<12) | (NUMMONS<<0)
	 */
	for (i = 1; artifact_names[i]; i++) continue;
	version.entity_count = (unsigned long)(i - 1);
	for (i = 1; objects[i].oc_class != ILLOBJ_CLASS; i++) continue;
	version.entity_count = (version.entity_count << 12) | (unsigned long)i;
	for (i = 0; mons[i].mlet; i++) continue;
	version.entity_count = (version.entity_count << 12) | (unsigned long)i;

	return;
}